

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void snapshot_with_uncomitted_data_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_seqnum_t seqnum;
  fdb_status fVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  fdb_kvs_handle *snap;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db0;
  fdb_kvs_handle *db1;
  fdb_file_handle *db_file;
  fdb_kvs_info info;
  fdb_kvs_config local_360;
  timeval __test_begin;
  char key [256];
  fdb_config local_230;
  char cmd [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  builtin_strncpy(cmd,"rm -rf  mvcc_test* > errorlog.txt",0x22);
  system(cmd);
  memleak_start();
  pcVar3 = (char *)malloc(0x20);
  srand(0x4d2);
  fdb_get_default_config();
  local_230.seqtree_opt = '\x01';
  local_230.wal_flush_before_commit = true;
  local_230.multi_kv_instances = true;
  local_230.buffercache_size = 0;
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&db_file,"./mvcc_test9",&local_230);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x30e);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x30e,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_kvs_open(db_file,&db0,(char *)0x0,&local_360);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x310);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x310,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_kvs_open(db_file,&db1,"db1",&local_360);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x312);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x312,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_kvs_open(db_file,&db2,"db2",&local_360);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x314);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x314,"void snapshot_with_uncomitted_data_test()");
  }
  uVar5 = 0;
  while (uVar5 != 10) {
    sprintf(key,"key%06d",(ulong)uVar5);
    builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxx<end>",0x20);
    sprintf(pcVar3,"value%d",(ulong)uVar5);
    pfVar1 = db0;
    sVar4 = strlen(key);
    fVar2 = fdb_set_kv(pfVar1,key,sVar4 + 1,pcVar3,0x20);
    pfVar1 = db1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x31e);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x31e,"void snapshot_with_uncomitted_data_test()");
    }
    sVar4 = strlen(key);
    fVar2 = fdb_set_kv(pfVar1,key,sVar4 + 1,pcVar3,0x20);
    pfVar1 = db2;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,800);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,800,"void snapshot_with_uncomitted_data_test()");
    }
    sVar4 = strlen(key);
    fVar2 = fdb_set_kv(pfVar1,key,sVar4 + 1,pcVar3,0x20);
    uVar5 = uVar5 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x322);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x322,"void snapshot_with_uncomitted_data_test()");
    }
  }
  fVar2 = fdb_get_kvs_info(db0,&info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x326);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x326,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_snapshot_open(db0,&snap,info.last_seqnum);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x328);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x328,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_get_kvs_info(db1,&info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x32b);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x32b,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_snapshot_open(db1,&snap,info.last_seqnum);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x32d);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x32d,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_get_kvs_info(db2,&info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x330);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x330,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_snapshot_open(db2,&snap,info.last_seqnum);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x332);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x332,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_commit(db_file,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x335);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x335,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_get_kvs_info(db1,&info);
  seqnum = info.last_seqnum;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x338);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x338,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_get_kvs_info(db2,&info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x33c);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x33c,"void snapshot_with_uncomitted_data_test()");
  }
  if (seqnum != info.last_seqnum) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x33d);
    snapshot_with_uncomitted_data_test()::__test_pass = '\x01';
    if (seqnum != info.last_seqnum) {
      __assert_fail("seqnum == info.last_seqnum",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x33d,"void snapshot_with_uncomitted_data_test()");
    }
  }
  fVar2 = fdb_get_kvs_info(db0,&info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x340);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x340,"void snapshot_with_uncomitted_data_test()");
  }
  if (seqnum != info.last_seqnum) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x341);
    snapshot_with_uncomitted_data_test()::__test_pass = '\x01';
    if (seqnum != info.last_seqnum) {
      __assert_fail("seqnum == info.last_seqnum",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x341,"void snapshot_with_uncomitted_data_test()");
    }
  }
  uVar5 = 0;
  while (uVar5 != 10) {
    sprintf(key,"key%06d",(ulong)uVar5);
    builtin_strncpy(pcVar3,"xxxxxxxxxxxxxxxxxxxxxxxxxx<end>",0x20);
    sprintf(pcVar3,"value%d",(ulong)uVar5);
    pfVar1 = db0;
    sVar4 = strlen(key);
    fVar2 = fdb_set_kv(pfVar1,key,sVar4 + 1,pcVar3,0x20);
    pfVar1 = db2;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x34b);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x34b,"void snapshot_with_uncomitted_data_test()");
    }
    sVar4 = strlen(key);
    fVar2 = fdb_set_kv(pfVar1,key,sVar4 + 1,pcVar3,0x20);
    uVar5 = uVar5 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x34d);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x34d,"void snapshot_with_uncomitted_data_test()");
    }
  }
  fVar2 = fdb_get_kvs_info(db1,&info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x352);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x352,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_snapshot_open(db1,&snap,info.last_seqnum);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x355);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x355,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_kvs_close(snap);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x357);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x357,"void snapshot_with_uncomitted_data_test()");
  }
  fVar2 = fdb_get_kvs_info(db2,&info);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_snapshot_open(db2,&snap,info.last_seqnum);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x35f);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x35f,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_snapshot_open(db2,&snap,seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x362);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x362,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_kvs_close(snap);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x364);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x364,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_get_kvs_info(db0,&info);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x368);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x368,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_snapshot_open(db0,&snap,info.last_seqnum);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x36c);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x36c,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_snapshot_open(db0,&snap,seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x36f);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x36f,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_kvs_close(snap);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x371);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x371,"void snapshot_with_uncomitted_data_test()");
    }
    fVar2 = fdb_close(db_file);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      if (fVar2 == FDB_RESULT_SUCCESS) {
        free(pcVar3);
        memleak_end();
        pcVar3 = "%s PASSED\n";
        if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
          pcVar3 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar3,"snapshot with uncomitted data in other KVS test");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x376);
      snapshot_with_uncomitted_data_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x376,"void snapshot_with_uncomitted_data_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x374);
    snapshot_with_uncomitted_data_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x374,"void snapshot_with_uncomitted_data_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x35b);
  snapshot_with_uncomitted_data_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x35b,"void snapshot_with_uncomitted_data_test()");
}

Assistant:

void snapshot_with_uncomitted_data_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db0, *db1, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_seqnum_t seqnum;
    fdb_status s; (void)s;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    srand(1234);
    config = fdb_get_default_config();
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0*1024*1024;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test9", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db0, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db1, "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db2, "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert docs in all KV stores
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db1, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    // try to open snapshot before commit
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_commit(db_file, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    seqnum = info.last_seqnum;

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    // now insert docs into default and db2 only, without commit
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // open snapshot on db1
    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // latest (comitted) seqnum
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on db2
    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db2, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on default KVS
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db0, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    memleak_end();

    TEST_RESULT("snapshot with uncomitted data in other KVS test");
}